

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.h
# Opt level: O0

byte_view __thiscall winmd::reader::file_view::open_file(file_view *this,string_view *path)

{
  bool bVar1;
  const_pointer __file;
  uint8_t *extraout_RDX;
  byte_view bVar2;
  allocator<char> local_149;
  string local_148;
  uint8_t *local_128;
  uint8_t *first;
  undefined4 local_118;
  int flags;
  string local_110;
  int local_ec;
  undefined1 local_e8 [4];
  int ret;
  stat st;
  allocator<char> local_41;
  string local_40;
  file_handle local_1c;
  string_view *psStack_18;
  file_handle file;
  string_view *path_local;
  
  psStack_18 = path;
  __file = impl::c_str<char>(path);
  local_1c.value = open(__file,0);
  bVar1 = file_handle::operator_cast_to_bool(&local_1c);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Could not open file \'",&local_41);
    impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[2]>
              (&local_40,psStack_18,(char (*) [2])0x1fe025);
  }
  local_ec = fstat(local_1c.value,(stat *)local_e8);
  if (local_ec < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Could not open file \'",(allocator<char> *)((long)&flags + 3));
    impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[2]>
              (&local_110,psStack_18,(char (*) [2])0x1fe025);
  }
  if (st.st_rdev == 0) {
    memset(this,0,0x10);
    byte_view::byte_view(&this->super_byte_view);
  }
  else {
    first._4_4_ = 0x8002;
    local_128 = (uint8_t *)mmap((void *)0x0,st.st_rdev,1,0x8002,local_1c.value,0);
    if (local_128 == (uint8_t *)0xffffffffffffffff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"Could not open file \'",&local_149);
      impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[2]>
                (&local_148,psStack_18,(char (*) [2])0x1fe025);
    }
    byte_view::byte_view(&this->super_byte_view,local_128,local_128 + st.st_rdev);
  }
  local_118 = 1;
  file_handle::~file_handle(&local_1c);
  bVar2.m_last = extraout_RDX;
  bVar2.m_first = (uint8_t *)this;
  return bVar2;
}

Assistant:

static byte_view open_file(std::string_view const& path)
        {
#if defined(_WIN32)
            auto input = impl::c_str(path);

            auto const input_length = static_cast<uint32_t>(path.length() + 1);
            int buffer_length = MultiByteToWideChar(CP_UTF8, 0, input, input_length, 0, 0);
            std::vector<wchar_t> output = std::vector<wchar_t>(buffer_length);
            int result = MultiByteToWideChar(CP_UTF8, 0, input, input_length, output.data(), buffer_length);

            if (result == 0)
            {
                switch (GetLastError())
                {
                case ERROR_INSUFFICIENT_BUFFER:
                    impl::throw_invalid("Insufficient buffer size");
                case ERROR_NO_UNICODE_TRANSLATION:
                    impl::throw_invalid("Untranslatable path");
                default:
                    impl::throw_invalid("Could not convert path");
                }
            }

            file_handle file{ CreateFile2(output.data(), GENERIC_READ, FILE_SHARE_READ, OPEN_EXISTING, nullptr) };

            if (!file)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }

            LARGE_INTEGER size{};
            GetFileSizeEx(file.value, &size);

            if (!size.QuadPart)
            {
                return{};
            }

            handle mapping{ CreateFileMappingW(file.value, nullptr, PAGE_READONLY, 0, 0, nullptr) };

            if (!mapping)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }

            auto const first{ static_cast<uint8_t const*>(MapViewOfFile(mapping.value, FILE_MAP_READ, 0, 0, 0)) };
            return{ first, first + size.QuadPart };
#else
            file_handle file{ open(impl::c_str(path), O_RDONLY, 0) };
            if (!file)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }

            struct stat st;
            int ret = fstat(file.value, &st);
            if (ret < 0)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }
            if (!st.st_size)
            {
                return{};
            }
            
#if defined(__linux__)
            auto const flags = MAP_PRIVATE | MAP_POPULATE;
#else
            auto const flags = MAP_PRIVATE;
#endif
            
            auto const first = static_cast<uint8_t const*>(mmap(nullptr, st.st_size, PROT_READ, flags, file.value, 0));
            if (first == MAP_FAILED)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }

            return{ first, first + st.st_size };
#endif
        }